

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O0

void vkt::BindingModel::anon_unknown_1::ImageSampleRenderInstance::
     writeImageSamplerDescriptorSetWithTemplate
               (DeviceInterface *vki,VkDevice device,ShaderInputInterface shaderInterface,
               bool isImmutable,ImageSampleInstanceImages *images,VkDescriptorSet descriptorSet,
               VkDescriptorSetLayout layout,Move<vk::Handle<(vk::HandleType)32>_> *updateTemplate,
               RawUpdateRegistry *updateRegistry,bool withPush,VkPipelineLayout pipelineLayout)

{
  deUint64 dVar1;
  RefData<vk::Handle<(vk::HandleType)32>_> data;
  undefined8 sampler;
  VkImageView VVar2;
  size_t sVar3;
  size_type sVar4;
  Handle<(vk::HandleType)32> *pHVar5;
  deUint8 *pdVar6;
  Move<vk::Handle<(vk::HandleType)32>_> local_1d8;
  RefData<vk::Handle<(vk::HandleType)32>_> local_1b8;
  VkDescriptorUpdateTemplateEntryKHR local_198;
  VkDescriptorUpdateTemplateEntryKHR local_178;
  VkDescriptorUpdateTemplateEntryKHR local_158;
  VkDescriptorUpdateTemplateEntryKHR local_138;
  undefined1 local_108 [8];
  VkDescriptorUpdateTemplateCreateInfoKHR templateCreateInfo;
  vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
  updateEntries;
  undefined1 local_88 [8];
  VkDescriptorImageInfo imageSamplers [2];
  VkSampler samplers [2];
  bool withPush_local;
  ImageSampleInstanceImages *images_local;
  bool isImmutable_local;
  ShaderInputInterface shaderInterface_local;
  VkDevice device_local;
  DeviceInterface *vki_local;
  VkPipelineLayout pipelineLayout_local;
  VkDescriptorSetLayout layout_local;
  VkDescriptorSet descriptorSet_local;
  
  samplers[1].m_internal._7_1_ = withPush;
  if ((!isImmutable) || (withPush)) {
    imageSamplers[1]._16_8_ = ImageSampleInstanceImages::getSamplerA(images);
  }
  else {
    ::vk::Handle<(vk::HandleType)20>::Handle
              ((Handle<(vk::HandleType)20> *)&imageSamplers[1].imageLayout,0);
  }
  if ((isImmutable) && ((samplers[1].m_internal._7_1_ & 1) == 0)) {
    ::vk::Handle<(vk::HandleType)20>::Handle(samplers,0);
  }
  else {
    samplers[0] = ImageSampleInstanceImages::getSamplerB(images);
  }
  sampler = imageSamplers[1]._16_8_;
  VVar2 = ImageSampleInstanceImages::getImageViewA(images);
  ::vk::makeDescriptorImageInfo
            ((VkDescriptorImageInfo *)local_88,(VkSampler)sampler,VVar2,
             VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL);
  VVar2 = ImageSampleInstanceImages::getImageViewB(images);
  ::vk::makeDescriptorImageInfo
            ((VkDescriptorImageInfo *)&imageSamplers[0].imageLayout,samplers[0],VVar2,
             VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL);
  std::
  vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
  ::vector((vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
            *)&templateCreateInfo.set);
  local_108._0_4_ = VK_STRUCTURE_TYPE_DESCRIPTOR_UPDATE_TEMPLATE_CREATE_INFO_KHR;
  templateCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  templateCreateInfo._4_4_ = 0;
  templateCreateInfo.pNext._0_4_ = 0;
  templateCreateInfo.pNext._4_4_ = 0;
  templateCreateInfo.flags = 0;
  templateCreateInfo.descriptorUpdateEntryCount = 0;
  templateCreateInfo.pDescriptorUpdateEntries._0_4_ = samplers[1].m_internal._7_1_ & 1;
  templateCreateInfo._32_8_ = layout.m_internal;
  templateCreateInfo.descriptorSetLayout.m_internal._0_4_ = 0;
  templateCreateInfo._48_8_ = pipelineLayout.m_internal;
  templateCreateInfo.pipelineLayout.m_internal._0_4_ = 0;
  RawUpdateRegistry::addWriteObject<vk::VkDescriptorImageInfo>
            (updateRegistry,(VkDescriptorImageInfo *)local_88);
  RawUpdateRegistry::addWriteObject<vk::VkDescriptorImageInfo>
            (updateRegistry,(VkDescriptorImageInfo *)&imageSamplers[0].imageLayout);
  if (shaderInterface == SHADER_INPUT_SINGLE_DESCRIPTOR) {
    sVar3 = RawUpdateRegistry::getWriteObjectOffset(updateRegistry,0);
    createTemplateBinding(&local_138,0,0,1,VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER,sVar3,0);
    std::
    vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
    ::push_back((vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
                 *)&templateCreateInfo.set,&local_138);
  }
  else if (shaderInterface == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS) {
    sVar3 = RawUpdateRegistry::getWriteObjectOffset(updateRegistry,0);
    createTemplateBinding(&local_158,0,0,1,VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER,sVar3,0);
    std::
    vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
    ::push_back((vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
                 *)&templateCreateInfo.set,&local_158);
    sVar3 = RawUpdateRegistry::getWriteObjectOffset(updateRegistry,1);
    createTemplateBinding(&local_178,1,0,1,VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER,sVar3,0);
    std::
    vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
    ::push_back((vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
                 *)&templateCreateInfo.set,&local_178);
  }
  else if (shaderInterface == SHADER_INPUT_DESCRIPTOR_ARRAY) {
    sVar3 = RawUpdateRegistry::getWriteObjectOffset(updateRegistry,0);
    createTemplateBinding(&local_198,0,0,2,VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER,sVar3,0x18);
    std::
    vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
    ::push_back((vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
                 *)&templateCreateInfo.set,&local_198);
  }
  templateCreateInfo._16_8_ =
       std::
       vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
       ::operator[]((vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
                     *)&templateCreateInfo.set,0);
  sVar4 = std::
          vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
          ::size((vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
                  *)&templateCreateInfo.set);
  templateCreateInfo.pNext._4_4_ = (undefined4)sVar4;
  ::vk::createDescriptorUpdateTemplateKHR
            (&local_1d8,vki,device,(VkDescriptorUpdateTemplateCreateInfoKHR *)local_108,
             (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_1b8,(Move *)&local_1d8);
  data.deleter.m_deviceIface = local_1b8.deleter.m_deviceIface;
  data.object.m_internal = local_1b8.object.m_internal;
  data.deleter.m_device = local_1b8.deleter.m_device;
  data.deleter.m_allocator = local_1b8.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)32>_>::operator=(updateTemplate,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)32>_>::~Move(&local_1d8);
  if ((samplers[1].m_internal._7_1_ & 1) == 0) {
    pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)32>_>::operator*
                       (&updateTemplate->super_RefBase<vk::Handle<(vk::HandleType)32>_>);
    dVar1 = pHVar5->m_internal;
    pdVar6 = RawUpdateRegistry::getRawPointer(updateRegistry);
    (*vki->_vptr_DeviceInterface[0x92])(vki,device,descriptorSet.m_internal,dVar1,pdVar6);
  }
  std::
  vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
  ::~vector((vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
             *)&templateCreateInfo.set);
  return;
}

Assistant:

void ImageSampleRenderInstance::writeImageSamplerDescriptorSetWithTemplate (const vk::DeviceInterface&						vki,
																			vk::VkDevice									device,
																			ShaderInputInterface							shaderInterface,
																			bool											isImmutable,
																			const ImageSampleInstanceImages&				images,
																			vk::VkDescriptorSet								descriptorSet,
																			vk::VkDescriptorSetLayout						layout,
																			vk::Move<vk::VkDescriptorUpdateTemplateKHR>&	updateTemplate,
																			RawUpdateRegistry&								updateRegistry,
																			bool											withPush,
																			vk::VkPipelineLayout							pipelineLayout)
{
	const vk::VkSampler					samplers[2]			=
	{
		(isImmutable && !withPush) ? (0) : (images.getSamplerA()),
		(isImmutable && !withPush) ? (0) : (images.getSamplerB()),
	};
	const vk::VkDescriptorImageInfo		imageSamplers[2]	=
	{
		vk::makeDescriptorImageInfo(samplers[0], images.getImageViewA(), vk::VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL),
		vk::makeDescriptorImageInfo(samplers[1], images.getImageViewB(), vk::VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL),
	};

	std::vector<vk::VkDescriptorUpdateTemplateEntryKHR>		updateEntries;
	vk::VkDescriptorUpdateTemplateCreateInfoKHR				templateCreateInfo	=
	{
		vk::VK_STRUCTURE_TYPE_DESCRIPTOR_UPDATE_TEMPLATE_CREATE_INFO_KHR,
		DE_NULL,
		0,
		0,			// updateCount
		DE_NULL,	// pUpdates
		withPush ? vk::VK_DESCRIPTOR_UPDATE_TEMPLATE_TYPE_PUSH_DESCRIPTORS_KHR : vk::VK_DESCRIPTOR_UPDATE_TEMPLATE_TYPE_DESCRIPTOR_SET_KHR,
		layout,
		vk::VK_PIPELINE_BIND_POINT_GRAPHICS,
		pipelineLayout,
		0
	};
	updateRegistry.addWriteObject(imageSamplers[0]);
	updateRegistry.addWriteObject(imageSamplers[1]);

	// combined image samplers
	switch (shaderInterface)
	{
		case SHADER_INPUT_SINGLE_DESCRIPTOR:
			updateEntries.push_back(createTemplateBinding(0, 0, 1, vk::VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, updateRegistry.getWriteObjectOffset(0), 0));
			break;

		case SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS:
			updateEntries.push_back(createTemplateBinding(0, 0, 1, vk::VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, updateRegistry.getWriteObjectOffset(0), 0));
			updateEntries.push_back(createTemplateBinding(1, 0, 1, vk::VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, updateRegistry.getWriteObjectOffset(1), 0));
			break;

		case SHADER_INPUT_DESCRIPTOR_ARRAY:
			updateEntries.push_back(createTemplateBinding(0, 0, 2, vk::VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, updateRegistry.getWriteObjectOffset(0), sizeof(imageSamplers[0])));
			break;

		default:
			DE_FATAL("Impossible");
	}

	templateCreateInfo.pDescriptorUpdateEntries		= &updateEntries[0];
	templateCreateInfo.descriptorUpdateEntryCount	= (deUint32)updateEntries.size();

	updateTemplate									= vk::createDescriptorUpdateTemplateKHR(vki, device, &templateCreateInfo);

	if (!withPush)
	{
		vki.updateDescriptorSetWithTemplateKHR(device, descriptorSet, *updateTemplate, updateRegistry.getRawPointer());
	}
}